

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O2

bool duckdb::IntegerCastOperation::HandleDigit<duckdb::IntegerCastData<short>,false>
               (IntegerCastData<short> *state,uint8_t digit)

{
  short sVar1;
  short sVar2;
  undefined7 in_register_00000031;
  
  sVar1 = state->result;
  sVar2 = (short)((((uint)CONCAT71(in_register_00000031,digit) ^ 0x7ffe) & 0xffff) / 10);
  if (sVar1 <= sVar2) {
    state->result = (short)CONCAT71(in_register_00000031,digit) + sVar1 * 10;
  }
  return sVar1 <= sVar2;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		using store_t = typename T::StoreType;
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.result < (NumericLimits<store_t>::Minimum() + digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 - digit);
		} else {
			if (DUCKDB_UNLIKELY(state.result > (NumericLimits<store_t>::Maximum() - digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 + digit);
		}
		return true;
	}